

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O0

int __thiscall s_i::get(s_i *this)

{
  char *pcVar1;
  bool bVar2;
  int local_24;
  s_i *this_local;
  
  bVar2 = atEnd(this);
  if (bVar2) {
    this_local._4_4_ = -1;
  }
  else {
    if ((this->utf8 & 1U) == 0) {
      pcVar1 = this->i;
      this->i = pcVar1 + 1;
      local_24 = (int)*pcVar1;
    }
    else {
      local_24 = read_UTF8_ch(&this->i);
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

int get() {
        if (atEnd())
            return -1;
        return utf8 ? read_UTF8_ch(&i) : *i++;
    }